

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O1

HighsInt __thiscall
free_format_parser::HMpsFF::fillMatrix(HMpsFF *this,HighsLogOptions *log_options)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer ptVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer piVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  pointer ptVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  value_type_conflict2 local_34;
  
  ptVar1 = (this->entries).
           super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar10 = (this->entries).
            super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar11 = 1;
  if ((long)ptVar10 - (long)ptVar1 >> 4 == (long)this->num_nz) {
    std::vector<double,_std::allocator<double>_>::resize(&this->a_value,(long)this->num_nz);
    std::vector<int,_std::allocator<int>_>::resize(&this->a_index,(long)this->num_nz);
    this_00 = &this->a_start;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (this_00,(long)this->num_col + 1,&local_34);
    if (ptVar10 == ptVar1) {
      uVar11 = 0;
    }
    else {
      ptVar1 = (this->entries).
               super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ptVar10 = (this->entries).
                super__Vector_base<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar8 = (long)ptVar10 - (long)ptVar1 >> 4;
      if (ptVar10 == ptVar1) {
        uVar15 = uVar8;
        uVar14 = 0;
LAB_001f7563:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar14,uVar15);
      }
      iVar13 = *(int *)&(ptVar1->super__Tuple_impl<0UL,_int,_int,_double>).
                        super__Tuple_impl<1UL,_int,_double>.field_0xc;
      bVar5 = 0 < this->num_nz;
      if (0 < this->num_nz) {
        pdVar2 = (this->a_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar16 = (long)(this->a_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar2 >> 3;
        piVar3 = (this->a_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (long)(this->a_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
        piVar4 = (this->a_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = (long)(this->a_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
        uVar17 = 0;
        iVar12 = iVar13;
        do {
          uVar15 = uVar8;
          uVar14 = uVar8;
          if ((uVar17 == uVar8) || (uVar15 = uVar16, uVar14 = uVar16, uVar17 == uVar16))
          goto LAB_001f7563;
          ptVar10 = ptVar1 + uVar17;
          pdVar2[uVar17] =
               (ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
               super__Tuple_impl<1UL,_int,_double>.super__Tuple_impl<2UL,_double>.
               super__Head_base<2UL,_double,_false>._M_head_impl;
          uVar15 = uVar7;
          uVar14 = uVar7;
          if (uVar17 == uVar7) goto LAB_001f7563;
          piVar3[uVar17] =
               (ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
               super__Tuple_impl<1UL,_int,_double>.super__Head_base<1UL,_int,_false>._M_head_impl;
          iVar13 = *(int *)&(ptVar10->super__Tuple_impl<0UL,_int,_int,_double>).
                            super__Tuple_impl<1UL,_int,_double>.field_0xc;
          uVar9 = iVar13 - iVar12;
          if (uVar9 != 0) {
            if (this->num_col <= iVar13) break;
            uVar14 = (ulong)iVar13;
            uVar15 = uVar6;
            if (uVar6 <= uVar14) goto LAB_001f7563;
            piVar4[uVar14] = (int)uVar17;
            iVar12 = iVar13;
            if (1 < (int)uVar9) {
              lVar18 = (ulong)uVar9 - 1;
              do {
                uVar14 = uVar14 - 1;
                if (uVar6 <= uVar14) goto LAB_001f7563;
                piVar4[uVar14] = (int)uVar17;
                lVar18 = lVar18 + -1;
              } while (lVar18 != 0);
            }
          }
          iVar13 = iVar12;
          uVar17 = uVar17 + 1;
          bVar5 = (long)uVar17 < (long)this->num_nz;
          iVar12 = iVar13;
        } while ((long)uVar17 < (long)this->num_nz);
      }
      if (!bVar5) {
        uVar11 = this->num_col;
        if (iVar13 < (int)uVar11) {
          piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar18 = (long)iVar13;
          do {
            piVar3[lVar18 + 1] = this->num_nz;
            lVar18 = lVar18 + 1;
            uVar11 = this->num_col;
          } while (lVar18 < (int)uVar11);
        }
        piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar15 = 0;
        uVar8 = 0;
        if (0 < (int)uVar11) {
          uVar15 = (ulong)uVar11;
        }
        do {
          uVar14 = uVar8;
          if (uVar15 == uVar14) goto LAB_001f7545;
          uVar8 = uVar14 + 1;
        } while (piVar3[uVar14] <= piVar3[uVar14 + 1]);
        highsLogUser(log_options,kError,"Non-monotonic starts in MPS file reader\n");
LAB_001f7545:
        uVar11 = (uint)((long)uVar14 < (long)(int)uVar11);
      }
    }
  }
  return uVar11;
}

Assistant:

HighsInt HMpsFF::fillMatrix(const HighsLogOptions& log_options) {
  size_t num_entries = entries.size();
  if (num_entries != static_cast<size_t>(num_nz)) return 1;

  a_value.resize(num_nz);
  a_index.resize(num_nz);
  a_start.assign(num_col + 1, 0);
  // Nothing to do if there are no entries in the matrix
  if (!num_entries) return 0;

  HighsInt newColIndex = std::get<0>(entries.at(0));

  for (HighsInt k = 0; k < num_nz; k++) {
    a_value.at(k) = std::get<2>(entries.at(k));
    a_index.at(k) = std::get<1>(entries.at(k));

    if (std::get<0>(entries.at(k)) != newColIndex) {
      HighsInt nEmptyCols = std::get<0>(entries.at(k)) - newColIndex;
      newColIndex = std::get<0>(entries.at(k));
      if (newColIndex >= num_col) return 1;

      a_start.at(newColIndex) = k;
      for (HighsInt i = 1; i < nEmptyCols; i++) {
        a_start.at(newColIndex - i) = k;
      }
    }
  }

  for (HighsInt col = newColIndex + 1; col <= num_col; col++)
    a_start[col] = num_nz;

  for (HighsInt i = 0; i < num_col; i++) {
    if (a_start[i] > a_start[i + 1]) {
      highsLogUser(log_options, HighsLogType::kError,
                   "Non-monotonic starts in MPS file reader\n");
      return 1;
    }
  }

  return 0;
}